

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamclient.h
# Opt level: O3

void __thiscall
hedg::Stream_Client::
send<boost::asio::basic_streambuf<std::allocator<char>>&,hedg::params::stream_order>
          (Stream_Client *this,code *f)

{
  streambuf *psVar1;
  undefined8 uVar2;
  streambuf *local_68;
  int local_60;
  uint uStack_5c;
  error_category *peStack_58;
  undefined **local_50 [2];
  error_code local_40;
  _Alloc_hider local_30;
  size_type local_28;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_20;
  
  psVar1 = &(this->super_Client<hedg::Stream_Client>).inp_buff_;
  (*f)(psVar1);
  local_60 = 0;
  uStack_5c = uStack_5c & 0xffffff00;
  peStack_58 = &boost::system::detail::cat_holder<void>::system_category_instance.
                super_error_category;
  local_68 = psVar1;
  boost::asio::
  write<boost::asio::ssl::stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,boost::asio::basic_streambuf_ref<std::allocator<char>>,boost::asio::detail::transfer_all_t>
            (&(this->super_Client<hedg::Stream_Client>).sock_,&local_68,&local_60,0);
  local_40.cat_ = peStack_58;
  if ((char)uStack_5c != '\x01') {
    return;
  }
  uVar2._4_4_ = uStack_5c;
  uVar2._0_4_ = local_60;
  std::runtime_error::runtime_error((runtime_error *)local_50,"write");
  local_50[0] = &PTR__system_error_001e6240;
  local_30._M_p = (pointer)&local_20;
  local_28 = 0;
  local_20._M_local_buf[0] = '\0';
  local_40._0_8_ = uVar2;
  boost::throw_exception<boost::system::system_error>((system_error *)local_50);
}

Assistant:

void send(void(*f)(Buff, T), T p) {
		f(inp_buff_, p);
		boost::asio::write(sock_, inp_buff_);
	}